

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseStringCharRef(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  xmlChar *pxVar1;
  byte *pbVar2;
  char *msg;
  byte bVar3;
  uint uVar4;
  xmlParserErrors code;
  byte *pbVar5;
  uint int1;
  bool bVar6;
  
  if ((str != (xmlChar **)0x0) && (pxVar1 = *str, pxVar1 != (xmlChar *)0x0)) {
    if ((*pxVar1 == '&') && (pxVar1[1] == '#')) {
      if (pxVar1[2] == 'x') {
        bVar3 = pxVar1[3];
        pbVar5 = pxVar1 + 3;
        bVar6 = bVar3 == 0x3b;
        if (bVar6) {
          int1 = 0;
        }
        else {
          int1 = 0;
          do {
            uVar4 = (uint)bVar3;
            if ((byte)(bVar3 - 0x30) < 10) {
              int1 = (int1 * 0x10 + uVar4) - 0x30;
            }
            else if ((byte)(bVar3 + 0x9f) < 6) {
              int1 = (int1 * 0x10 + uVar4) - 0x57;
            }
            else {
              if (5 < (byte)(bVar3 + 0xbf)) {
                code = XML_ERR_INVALID_HEX_CHARREF;
                goto LAB_00140eae;
              }
              int1 = (int1 * 0x10 + uVar4) - 0x37;
            }
            if (0x10ffff < (int)int1) {
              int1 = 0x110000;
            }
            bVar3 = pbVar5[1];
            pbVar5 = pbVar5 + 1;
            bVar6 = bVar3 == 0x3b;
          } while (!bVar6);
        }
      }
      else {
        pbVar5 = pxVar1 + 2;
        bVar3 = pxVar1[2];
        bVar6 = bVar3 == 0x3b;
        if (bVar6) {
          int1 = 0;
        }
        else {
          code = XML_ERR_INVALID_DEC_CHARREF;
          if ((byte)(bVar3 - 0x30) < 10) {
            int1 = 0;
            pbVar2 = pxVar1 + 3;
            do {
              pbVar5 = pbVar2;
              int1 = ((uint)bVar3 + int1 * 10) - 0x30;
              if (0x10ffff < (int)int1) {
                int1 = 0x110000;
              }
              bVar3 = *pbVar5;
              bVar6 = bVar3 == 0x3b;
              if (bVar6) goto LAB_00140ebb;
              pbVar2 = pbVar5 + 1;
            } while ((byte)(bVar3 - 0x30) < 10);
          }
LAB_00140eae:
          int1 = 0;
          xmlFatalErr(ctxt,code,(char *)0x0);
        }
      }
LAB_00140ebb:
      *str = pbVar5 + bVar6;
      if ((int)int1 < 0x110000) {
        if ((int)int1 < 0x100) {
          if (0x1f < (int)int1) {
            return int1;
          }
          if ((int1 < 0xe) && ((0x2600U >> (int1 & 0x1f) & 1) != 0)) {
            return int1;
          }
        }
        else if (int1 - 0x10000 < 0xffffd800 || int1 - 0xe000 < 0x1ffe) {
          return int1;
        }
        msg = "xmlParseStringCharRef: invalid xmlChar value %d\n";
      }
      else {
        msg = "xmlParseStringCharRef: character reference out of bounds\n";
      }
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_INVALID_CHAR,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,int1,msg,int1);
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_INVALID_CHARREF,(char *)0x0);
    }
  }
  return 0;
}

Assistant:

static int
xmlParseStringCharRef(xmlParserCtxtPtr ctxt, const xmlChar **str) {
    const xmlChar *ptr;
    xmlChar cur;
    int val = 0;

    if ((str == NULL) || (*str == NULL)) return(0);
    ptr = *str;
    cur = *ptr;
    if ((cur == '&') && (ptr[1] == '#') && (ptr[2] == 'x')) {
	ptr += 3;
	cur = *ptr;
	while (cur != ';') { /* Non input consuming loop */
	    if ((cur >= '0') && (cur <= '9'))
	        val = val * 16 + (cur - '0');
	    else if ((cur >= 'a') && (cur <= 'f'))
	        val = val * 16 + (cur - 'a') + 10;
	    else if ((cur >= 'A') && (cur <= 'F'))
	        val = val * 16 + (cur - 'A') + 10;
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_HEX_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    ptr++;
	    cur = *ptr;
	}
	if (cur == ';')
	    ptr++;
    } else if  ((cur == '&') && (ptr[1] == '#')){
	ptr += 2;
	cur = *ptr;
	while (cur != ';') { /* Non input consuming loops */
	    if ((cur >= '0') && (cur <= '9'))
	        val = val * 10 + (cur - '0');
	    else {
		xmlFatalErr(ctxt, XML_ERR_INVALID_DEC_CHARREF, NULL);
		val = 0;
		break;
	    }
	    if (val > 0x110000)
	        val = 0x110000;

	    ptr++;
	    cur = *ptr;
	}
	if (cur == ';')
	    ptr++;
    } else {
	xmlFatalErr(ctxt, XML_ERR_INVALID_CHARREF, NULL);
	return(0);
    }
    *str = ptr;

    /*
     * [ WFC: Legal Character ]
     * Characters referred to using character references must match the
     * production for Char.
     */
    if (val >= 0x110000) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                "xmlParseStringCharRef: character reference out of bounds\n",
                val);
    } else if (IS_CHAR(val)) {
        return(val);
    } else {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
			  "xmlParseStringCharRef: invalid xmlChar value %d\n",
			  val);
    }
    return(0);
}